

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoLinear.h
# Opt level: O3

void pzgeom::TPZGeoLinear::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  Fad<double> *pFVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  Fad<double> xi;
  Fad<double> local_110;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
  local_f0;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  local_e0;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  local_c0;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  local_a8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  local_88;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> local_70;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_50;
  
  pFVar1 = loc->fStore;
  local_110.val_ = pFVar1->val_;
  uVar4 = (pFVar1->dx_).num_elts;
  local_110.dx_.ptr_to_data = (double *)0x0;
  local_110.dx_.num_elts = uVar4;
  if ((long)(int)uVar4 != 0) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar4) {
      uVar3 = (long)(int)uVar4 << 3;
    }
    local_110.dx_.ptr_to_data = (double *)operator_new__(uVar3);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_110.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(pFVar1->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar4);
  }
  local_110.defaultVal = pFVar1->defaultVal;
  uVar4 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar4) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,uVar3,0);
      local_50.fadexpr_.left_.constant_ = 1.0;
      local_50.fadexpr_.left_.defaultVal = 0.0;
      local_a8.fadexpr_.left_.defaultVal = 0.0;
      local_a8.fadexpr_.right_ = &local_50;
      local_88.fadexpr_.left_ = &local_a8;
      local_88.fadexpr_.right_.constant_ = 0.5;
      local_88.fadexpr_.right_.defaultVal = 0.0;
      local_50.fadexpr_.right_ = &local_110;
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,uVar3,1);
      local_70.fadexpr_.left_.constant_ = 1.0;
      local_70.fadexpr_.left_.defaultVal = 0.0;
      local_e0.fadexpr_.left_.defaultVal = 0.0;
      local_e0.fadexpr_.right_ = &local_70;
      local_c0.fadexpr_.left_ = &local_e0;
      local_c0.fadexpr_.right_.constant_ = 0.5;
      local_c0.fadexpr_.right_.defaultVal = 0.0;
      local_f0.fadexpr_.left_ = &local_88;
      local_f0.fadexpr_.right_ = &local_c0;
      local_70.fadexpr_.right_ = &local_110;
      Fad<double>::operator=((Fad<double> *)((long)&x->fStore->val_ + lVar2),&local_f0);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  Fad<double>::~Fad(&local_110);
  return;
}

Assistant:

inline void TPZGeoLinear::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        T xi = loc[0];
        int nrow = nodes.Rows();
        for(int i = 0; i < nrow; i++)
        {
            x[i] = nodes.GetVal(i,0)*(1.-xi)*0.5+nodes.GetVal(i,1)*(1.+xi)*0.5;
        }
        
    }